

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::SetAttributes
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this,void *address,
          uchar attributes)

{
  HeapInfo *pHVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (-1 < (char)attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x86,"((attributes & FinalizeBit) != 0)","(attributes & FinalizeBit) != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  SmallHeapBlockT<MediumAllocationBlockAttributes>::SetAttributes
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,address,attributes);
  this->finalizeCount = this->finalizeCount + 1;
  pHVar1 = ((this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
            super_SmallHeapBlockT<MediumAllocationBlockAttributes>.heapBucket)->heapInfo;
  pHVar1->liveFinalizableObjectCount = pHVar1->liveFinalizableObjectCount + 1;
  pHVar1->newFinalizableObjectCount = pHVar1->newFinalizableObjectCount + 1;
  return;
}

Assistant:

void
SmallFinalizableHeapBlockT<TBlockAttributes>::SetAttributes(void * address, unsigned char attributes)
{
    Assert((attributes & FinalizeBit) != 0);
    __super::SetAttributes(address, attributes);
    finalizeCount++;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
    {
        AssertMsg(!this->isPendingConcurrentSweepPrep, "Finalizable blocks don't support allocations during concurrent sweep.");
    }
#endif

#ifdef RECYCLER_FINALIZE_CHECK
    HeapInfo * heapInfo = this->heapBucket->heapInfo;
    heapInfo->liveFinalizableObjectCount++;
    heapInfo->newFinalizableObjectCount++;
#endif
}